

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_3)

{
  bool bVar1;
  char *pcVar2;
  String *in_RDI;
  longlong *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb8;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  StreamingListener *in_stack_ffffffffffffffe0;
  
  bVar1 = UnitTest::Passed((UnitTest *)0x206fef);
  UnitTest::elapsed_time((UnitTest *)0x207000);
  StreamableToString<long_long>(in_stack_ffffffffffffffa8);
  pcVar2 = String::c_str((String *)&stack0xffffffffffffffa8);
  String::Format(&stack0xffffffffffffffb8,"event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",
                 (ulong)bVar1,pcVar2);
  String::operator_cast_to_string(in_stack_ffffffffffffffb8);
  Send(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_38);
  String::~String(in_RDI);
  String::~String(in_RDI);
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test, int /* iteration */) {
    Send(String::Format("event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",
                        unit_test.Passed(),
                        StreamableToString(unit_test.elapsed_time()).c_str()));
  }